

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

UniValue * __thiscall RPCHelpMan::Arg<UniValue>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  RPCHelpMan *in_RDX;
  RPCHelpMan *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  size_t i;
  UniValue *pUVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pUVar2 = in_RDI;
  GetParamIndex(in_RDX,in_stack_00000000);
  ArgValue<UniValue_const&>(in_RSI,(size_t)in_RDI);
  UniValue::UniValue((UniValue *)in_RDX,pUVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }